

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

BOOL Js::JavascriptOperators::SetGlobalPropertyNoHost
               (char16 *propertyName,charcount_t propertyLength,Var value,
               ScriptContext *scriptContext)

{
  GlobalObject *this;
  IndexType IVar1;
  BOOL BVar2;
  PropertyRecord *local_28;
  PropertyRecord *propertyRecord;
  uint32 index;
  
  this = (scriptContext->super_ScriptContextBase).globalObject;
  local_28 = (PropertyRecord *)0x0;
  IVar1 = GetIndexTypeFromString
                    (propertyName,propertyLength,scriptContext,(uint32 *)((long)&propertyRecord + 4)
                     ,&local_28,true);
  if (IVar1 == IndexType_Number) {
    BVar2 = DynamicObject::SetItem
                      ((DynamicObject *)this,propertyRecord._4_4_,value,PropertyOperation_None);
  }
  else {
    BVar2 = DynamicObject::SetProperty
                      ((DynamicObject *)this,local_28->pid,value,PropertyOperation_None,
                       (PropertyValueInfo *)0x0);
  }
  return BVar2;
}

Assistant:

BOOL JavascriptOperators::SetGlobalPropertyNoHost(char16 const * propertyName, charcount_t propertyLength, Var value, ScriptContext * scriptContext)
    {
        GlobalObject * globalObject = scriptContext->GetGlobalObject();
        uint32 index;
        PropertyRecord const * propertyRecord = nullptr;
        IndexType indexType = GetIndexTypeFromString(propertyName, propertyLength, scriptContext, &index, &propertyRecord, true);

        if (indexType == IndexType_Number)
        {
            return globalObject->DynamicObject::SetItem(index, value, PropertyOperation_None);
        }
        return globalObject->DynamicObject::SetProperty(propertyRecord->GetPropertyId(), value, PropertyOperation_None, NULL);
    }